

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O0

int http_RecvMessage(SOCKINFO *info,http_parser_t *parser,http_method_t request_method,
                    int *timeout_secs,int *http_error_code)

{
  bool bVar1;
  parse_status_t pVar2;
  ulong local_58;
  size_t buf_len;
  char *buf;
  parse_status_t local_40;
  int ok_on_close;
  int num_read;
  parse_status_t status;
  int line;
  int ret;
  int *http_error_code_local;
  int *timeout_secs_local;
  http_method_t request_method_local;
  http_parser_t *parser_local;
  SOCKINFO *info_local;
  
  num_read = 0;
  local_40 = PARSE_SUCCESS;
  bVar1 = false;
  local_58 = 0x400;
  *http_error_code = 500;
  buf_len = (size_t)malloc(0x400);
  if ((void *)buf_len != (void *)0x0) {
    if (request_method == HTTPMETHOD_UNKNOWN) {
      parser_request_init(parser);
    }
    else {
      parser_response_init(parser,request_method);
    }
    do {
      if (local_58 <= (ulong)(long)(int)local_40) {
        free((void *)buf_len);
        local_58 = local_58 << 1;
        buf_len = (size_t)malloc(local_58);
        if ((void *)buf_len == (void *)0x0) {
          status = 0xffffff98;
          goto LAB_00112e38;
        }
      }
      local_40 = sock_read(info,(char *)buf_len,local_58,timeout_secs);
      if ((int)local_40 < 1) {
        if (local_40 == PARSE_SUCCESS) {
          if (bVar1) {
            UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x1c5,
                       "<<< (RECVD) <<<\n%s\n-----------------\n",(parser->msg).msg.buf);
            print_http_headers(&parser->msg);
            num_read = 0x1ca;
            status = PARSE_SUCCESS;
          }
          else {
            *http_error_code = 400;
            num_read = 0x1d1;
            status = 0xffffff89;
          }
        }
        else {
          *http_error_code = parser->http_error_code;
          num_read = 0x1d7;
          status = local_40;
        }
        goto LAB_00112e38;
      }
      pVar2 = parser_append(parser,(char *)buf_len,(long)(int)local_40);
      switch(pVar2) {
      case PARSE_SUCCESS:
        goto switchD_00112cd1_caseD_0;
      default:
        break;
      case PARSE_INCOMPLETE_ENTITY:
        bVar1 = true;
        break;
      case PARSE_FAILURE:
      case PARSE_NO_MATCH:
        *http_error_code = parser->http_error_code;
        num_read = 0x1b1;
        status = 0xffffff89;
        goto LAB_00112e38;
      case PARSE_CONTINUE_1:
        num_read = 0x1ba;
        status = PARSE_SUCCESS;
        goto LAB_00112e38;
      }
    } while( true );
  }
  status = 0xffffff98;
LAB_00112e38:
  free((void *)buf_len);
  if (status != PARSE_SUCCESS) {
    UpnpPrintf(UPNP_ALL,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",num_read,
               "(http_RecvMessage): Error %d, http_error_code = %d.\n",(ulong)status,
               *http_error_code);
  }
  return status;
switchD_00112cd1_caseD_0:
  UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpreadwrite.c",0x19c,
             "<<< (RECVD) <<<\n%s\n-----------------\n",(parser->msg).msg.buf);
  print_http_headers(&parser->msg);
  if ((g_maxContentLength == 0) || (parser->content_length <= (uint)g_maxContentLength)) {
    num_read = 0x1ab;
    status = PARSE_SUCCESS;
  }
  else {
    *http_error_code = 0x19d;
    num_read = 0x1a7;
    status = 0xfffffe06;
  }
  goto LAB_00112e38;
}

Assistant:

int http_RecvMessage(SOCKINFO *info,
	http_parser_t *parser,
	http_method_t request_method,
	int *timeout_secs,
	int *http_error_code)
{
	int ret = UPNP_E_SUCCESS;
	int line = 0;
	parse_status_t status;
	int num_read = 0;
	int ok_on_close = 0;
	char *buf;
	size_t buf_len = 1024;

	*http_error_code = HTTP_INTERNAL_SERVER_ERROR;
	buf = malloc(buf_len);
	if (!buf) {
		ret = UPNP_E_OUTOF_MEMORY;
		goto ExitFunction;
	}
	if (request_method == (http_method_t)HTTPMETHOD_UNKNOWN) {
		parser_request_init(parser);
	} else {
		parser_response_init(parser, request_method);
	}

	while (1) {
		/* Double the bet if needed */
		/* We should have already exited the loop if the value was <= 0
		 * so the cast is safe */
		if ((size_t)num_read >= buf_len) {
			free(buf);
			buf_len = 2 * buf_len;
			buf = malloc(buf_len);
			if (!buf) {
				ret = UPNP_E_OUTOF_MEMORY;
				goto ExitFunction;
			}
		}
		num_read = sock_read(info, buf, buf_len, timeout_secs);
		if (num_read > 0) {
			/* got data */
			status = parser_append(parser, buf, (size_t)num_read);
			switch (status) {
			case PARSE_SUCCESS:
				UpnpPrintf(UPNP_INFO,
					HTTP,
					__FILE__,
					__LINE__,
					"<<< (RECVD) "
					"<<<\n%s\n-----------------\n",
					parser->msg.msg.buf);
				print_http_headers(&parser->msg);
				if (g_maxContentLength > 0 &&
					parser->content_length >
						(unsigned int)
							g_maxContentLength) {
					*http_error_code =
						HTTP_REQ_ENTITY_TOO_LARGE;
					line = __LINE__;
					ret = UPNP_E_OUTOF_BOUNDS;
					goto ExitFunction;
				}
				line = __LINE__;
				ret = 0;
				goto ExitFunction;
			case PARSE_FAILURE:
			case PARSE_NO_MATCH:
				*http_error_code = parser->http_error_code;
				line = __LINE__;
				ret = UPNP_E_BAD_HTTPMSG;
				goto ExitFunction;
			case PARSE_INCOMPLETE_ENTITY:
				/* read until close */
				ok_on_close = 1;
				break;
			case PARSE_CONTINUE_1:
				/* Web post request. */
				line = __LINE__;
				ret = PARSE_SUCCESS;
				goto ExitFunction;
			default:
				break;
			}
		} else if (num_read == 0) {
			if (ok_on_close) {
				UpnpPrintf(UPNP_INFO,
					HTTP,
					__FILE__,
					__LINE__,
					"<<< (RECVD) "
					"<<<\n%s\n-----------------\n",
					parser->msg.msg.buf);
				print_http_headers(&parser->msg);
				line = __LINE__;
				ret = 0;
				goto ExitFunction;
			} else {
				/* partial msg */
				*http_error_code =
					HTTP_BAD_REQUEST; /* or response */
				line = __LINE__;
				ret = UPNP_E_BAD_HTTPMSG;
				goto ExitFunction;
			}
		} else {
			*http_error_code = parser->http_error_code;
			line = __LINE__;
			ret = num_read;
			goto ExitFunction;
		}
	}

ExitFunction:
	free(buf);
	if (ret != UPNP_E_SUCCESS) {
		UpnpPrintf(UPNP_ALL,
			HTTP,
			__FILE__,
			line,
			"(http_RecvMessage): Error %d, http_error_code = %d.\n",
			ret,
			*http_error_code);
	}

	return ret;
}